

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_bool (anonymous_namespace)::miniz::tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 (*pamVar1) [288];
  mz_uint16 *pmVar2;
  byte bVar3;
  ushort uVar4;
  mz_uint8 *pmVar5;
  ushort uVar6;
  byte *pbVar7;
  mz_uint8 (*pamVar8) [288];
  long lVar9;
  mz_uint16 (*pamVar10) [288];
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  mz_uint16 *pmVar15;
  int iVar16;
  ulong uVar17;
  mz_uint8 *pmVar18;
  uint uVar19;
  ulong uVar20;
  byte *pbVar21;
  byte bVar22;
  int iVar23;
  byte bVar24;
  uint uVar25;
  bool bVar26;
  mz_uint8 code_sizes_to_pack [320];
  byte abStack_2b8 [320];
  byte local_178 [328];
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar23 = 0x11f;
    lVar12 = 0x9067;
    do {
      if (lVar12 - 0x8f49U < 0x102) {
        iVar23 = 0x101;
        break;
      }
      iVar23 = iVar23 + -1;
      lVar9 = lVar12 + -0x14;
      lVar12 = lVar12 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar9) == '\0');
    iVar16 = 0x1f;
    lVar12 = 36999;
    do {
      if (lVar12 - 0x9069U < 2) {
        iVar16 = 1;
        break;
      }
      iVar16 = iVar16 + -1;
      lVar9 = lVar12 + -0x14;
      lVar12 = lVar12 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar9) == '\0');
    memcpy(local_178,d->m_huff_code_sizes,(long)iVar23);
    memcpy(local_178 + iVar23,d->m_huff_code_sizes + 1,(long)iVar16);
    pamVar1 = d->m_huff_count + 2;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0xe) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x16) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1e) = 0;
    pamVar10 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar10 + 2) + 0x24) = 0;
    if (iVar16 + iVar23 == 0) {
      uVar11 = 0;
      uVar17 = 0xff;
      uVar19 = 0;
      uVar13 = 0;
    }
    else {
      pmVar2 = d->m_huff_count[2] + 0x12;
      uVar20 = 0;
      uVar13 = 0;
      uVar19 = 0;
      uVar11 = 0;
      uVar14 = 0xff;
      do {
        bVar22 = local_178[uVar20];
        uVar17 = (ulong)bVar22;
        bVar24 = (byte)uVar14;
        if (uVar17 == 0) {
          if (uVar11 != 0) {
            if (uVar11 < 3) {
              (*pamVar1)[uVar14] = (*pamVar1)[uVar14] + (short)uVar11;
              uVar25 = uVar13;
              do {
                uVar13 = uVar25 + 1;
                abStack_2b8[uVar25] = bVar24;
                uVar11 = uVar11 - 1;
                uVar25 = uVar13;
              } while (uVar11 != 0);
            }
            else {
              pmVar15 = d->m_huff_count[2] + 0x10;
              *pmVar15 = *pmVar15 + 1;
              uVar25 = uVar13 + 1;
              abStack_2b8[uVar13] = 0x10;
              uVar13 = uVar13 + 2;
              abStack_2b8[uVar25] = (char)uVar11 - 3;
            }
          }
          uVar19 = uVar19 + 1;
          if (uVar19 == 0x8a) {
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar13] = 0x12;
            abStack_2b8[uVar13 + 1] = 0x7f;
LAB_0019e0e0:
            uVar13 = uVar13 + 2;
            uVar11 = 0;
            goto LAB_0019e0e3;
          }
          uVar11 = 0;
        }
        else {
          if (uVar19 != 0) {
            if (uVar19 < 3) {
              (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar19;
              uVar25 = uVar13;
              do {
                uVar13 = uVar25 + 1;
                abStack_2b8[uVar25] = 0;
                uVar19 = uVar19 - 1;
                uVar25 = uVar13;
              } while (uVar19 != 0);
            }
            else {
              bVar26 = uVar19 < 0xb;
              pmVar15 = pmVar2;
              if (bVar26) {
                pmVar15 = d->m_huff_count[2] + 0x11;
              }
              *pmVar15 = *pmVar15 + 1;
              abStack_2b8[uVar13] = 0x12 - bVar26;
              abStack_2b8[uVar13 + 1] = (bVar26 * '\b' + (char)uVar19) - 0xb;
              uVar13 = uVar13 + 2;
            }
          }
          if (bVar22 == bVar24) {
            uVar11 = uVar11 + 1;
            if (uVar11 == 6) {
              pmVar15 = d->m_huff_count[2] + 0x10;
              *pmVar15 = *pmVar15 + 1;
              abStack_2b8[uVar13] = 0x10;
              abStack_2b8[uVar13 + 1] = 3;
              goto LAB_0019e0e0;
            }
LAB_0019e0e3:
            uVar19 = 0;
          }
          else {
            if (uVar11 != 0) {
              if (uVar11 < 3) {
                (*pamVar1)[uVar14] = (*pamVar1)[uVar14] + (short)uVar11;
                uVar19 = uVar13;
                do {
                  uVar13 = uVar19 + 1;
                  abStack_2b8[uVar19] = bVar24;
                  uVar11 = uVar11 - 1;
                  uVar19 = uVar13;
                } while (uVar11 != 0);
              }
              else {
                pmVar15 = d->m_huff_count[2] + 0x10;
                *pmVar15 = *pmVar15 + 1;
                uVar19 = uVar13 + 1;
                abStack_2b8[uVar13] = 0x10;
                uVar13 = uVar13 + 2;
                abStack_2b8[uVar19] = (char)uVar11 - 3;
              }
            }
            uVar14 = (ulong)uVar13;
            (*pamVar1)[uVar17] = (*pamVar1)[uVar17] + 1;
            uVar13 = uVar13 + 1;
            abStack_2b8[uVar14] = bVar22;
            uVar11 = 0;
            uVar19 = 0;
          }
        }
        uVar20 = uVar20 + 1;
        uVar14 = uVar17;
      } while (uVar20 != (uint)(iVar16 + iVar23));
    }
    if (uVar11 == 0) {
      if (uVar19 != 0) {
        if (uVar19 < 3) {
          (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar19;
          uVar11 = uVar13;
          do {
            uVar13 = uVar11 + 1;
            abStack_2b8[uVar11] = 0;
            uVar19 = uVar19 - 1;
            uVar11 = uVar13;
          } while (uVar19 != 0);
        }
        else {
          if (uVar19 < 0xb) {
            pmVar2 = d->m_huff_count[2] + 0x11;
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar13] = 0x11;
            bVar22 = (char)uVar19 - 3;
          }
          else {
            pmVar2 = d->m_huff_count[2] + 0x12;
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar13] = 0x12;
            bVar22 = (char)uVar19 - 0xb;
          }
          abStack_2b8[uVar13 + 1] = bVar22;
          uVar13 = uVar13 + 2;
        }
      }
    }
    else if (uVar11 < 3) {
      (*pamVar1)[uVar17] = (*pamVar1)[uVar17] + (short)uVar11;
      uVar19 = uVar13;
      do {
        uVar13 = uVar19 + 1;
        abStack_2b8[uVar19] = (byte)uVar17;
        uVar11 = uVar11 - 1;
        uVar19 = uVar13;
      } while (uVar11 != 0);
    }
    else {
      pmVar2 = d->m_huff_count[2] + 0x10;
      *pmVar2 = *pmVar2 + 1;
      uVar19 = uVar13 + 1;
      abStack_2b8[uVar13] = 0x10;
      uVar13 = uVar13 + 2;
      abStack_2b8[uVar19] = (char)uVar11 - 3;
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    d->m_bit_buffer = d->m_bit_buffer | 2 << ((byte)d->m_bits_in & 0x1f);
    uVar11 = d->m_bits_in + 2;
    d->m_bits_in = uVar11;
    while (7 < uVar11) {
      pmVar18 = d->m_pOutput_buf;
      if (pmVar18 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar18 + 1;
        *pmVar18 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar11 = d->m_bits_in - 8;
      d->m_bits_in = uVar11;
    }
    if (0x1f < iVar23 - 0x101U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                    ,0xc3f,
                    "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                   );
    }
    d->m_bit_buffer = d->m_bit_buffer | iVar23 - 0x101U << ((byte)uVar11 & 0x1f);
    uVar19 = uVar11 + 5;
    d->m_bits_in = uVar19;
    if (2 < uVar11) {
      do {
        pmVar18 = d->m_pOutput_buf;
        if (pmVar18 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar18 + 1;
          *pmVar18 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar19 = d->m_bits_in - 8;
        d->m_bits_in = uVar19;
      } while (7 < uVar19);
    }
    if (0x1f < iVar16 - 1U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                    ,0xc40,
                    "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                   );
    }
    d->m_bit_buffer = d->m_bit_buffer | iVar16 - 1U << ((byte)uVar19 & 0x1f);
    uVar11 = uVar19 + 5;
    d->m_bits_in = uVar11;
    if (2 < uVar19) {
      do {
        pmVar18 = d->m_pOutput_buf;
        if (pmVar18 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar18 + 1;
          *pmVar18 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar11 = d->m_bits_in - 8;
        d->m_bits_in = uVar11;
      } while (7 < uVar11);
    }
    uVar17 = 0x12;
    do {
      iVar23 = (int)uVar17;
      if (d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar17]] != '\0') goto LAB_0019e301;
      uVar17 = (ulong)(iVar23 - 1);
    } while (iVar23 != 0);
    iVar23 = -1;
LAB_0019e301:
    iVar16 = 3;
    if (3 < iVar23) {
      iVar16 = iVar23;
    }
    if (0xf < iVar16 - 3U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                    ,0xc47,
                    "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                   );
    }
    d->m_bit_buffer = d->m_bit_buffer | iVar16 - 3U << ((byte)uVar11 & 0x1f);
    d->m_bits_in = uVar11 + 4;
    if (3 < uVar11) {
      do {
        pmVar18 = d->m_pOutput_buf;
        if (pmVar18 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar18 + 1;
          *pmVar18 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar11 = d->m_bits_in - 8;
        d->m_bits_in = uVar11;
      } while (7 < uVar11);
    }
    uVar17 = 0;
    do {
      uVar11 = (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar17]];
      if (7 < uVar11) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0xc4a,
                      "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                     );
      }
      d->m_bit_buffer = d->m_bit_buffer | uVar11 << ((byte)d->m_bits_in & 0x1f);
      uVar11 = d->m_bits_in + 3;
      d->m_bits_in = uVar11;
      while (7 < uVar11) {
        pmVar18 = d->m_pOutput_buf;
        if (pmVar18 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar18 + 1;
          *pmVar18 = (mz_uint8)d->m_bit_buffer;
        }
        d->m_bit_buffer = d->m_bit_buffer >> 8;
        uVar11 = d->m_bits_in - 8;
        d->m_bits_in = uVar11;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != iVar16 + 1);
    if (uVar13 != 0) {
      uVar17 = 0;
      do {
        bVar22 = abStack_2b8[uVar17];
        uVar14 = (ulong)bVar22;
        if (0x12 < uVar14) {
          __assert_fail("code < TDEFL_MAX_HUFF_SYMBOLS_2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xc4f,
                        "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                       );
        }
        uVar4 = d->m_huff_codes[2][uVar14];
        bVar24 = d->m_huff_code_sizes[2][uVar14];
        if (uVar4 >> (bVar24 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xc50,
                        "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                       );
        }
        d->m_bit_buffer = d->m_bit_buffer | (uint)uVar4 << ((byte)d->m_bits_in & 0x1f);
        uVar11 = (uint)bVar24 + d->m_bits_in;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar18 = d->m_pOutput_buf;
          if (pmVar18 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar18 + 1;
            *pmVar18 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar11 = d->m_bits_in - 8;
          d->m_bits_in = uVar11;
        }
        uVar19 = (int)uVar17 + 1;
        if (0xf < bVar22) {
          bVar22 = "\x02\x03\a"[bVar22 - 0x10];
          if (abStack_2b8[uVar19] >> (bVar22 & 0x1f) != 0) {
            __assert_fail("bits <= ((1U << len) - 1U)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0xc53,
                          "void (anonymous namespace)::miniz::tdefl_start_dynamic_block(tdefl_compressor *)"
                         );
          }
          d->m_bit_buffer = d->m_bit_buffer | (uint)abStack_2b8[uVar19] << ((byte)uVar11 & 0x1f);
          uVar19 = (int)uVar17 + 2;
          uVar11 = (int)(char)bVar22 + uVar11;
          d->m_bits_in = uVar11;
          while (7 < uVar11) {
            pmVar18 = d->m_pOutput_buf;
            if (pmVar18 < d->m_pOutput_buf_end) {
              d->m_pOutput_buf = pmVar18 + 1;
              *pmVar18 = (mz_uint8)d->m_bit_buffer;
            }
            d->m_bit_buffer = d->m_bit_buffer >> 8;
            uVar11 = d->m_bits_in - 8;
            d->m_bits_in = uVar11;
          }
        }
        uVar17 = (ulong)uVar19;
      } while (uVar19 < uVar13);
    }
  }
  else {
    memset(d->m_huff_code_sizes,8,0x90);
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x90) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x91) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x92) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x93) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x94) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x95) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x96) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x97) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x98) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x99) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9a) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9b) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9c) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9d) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9e) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x9f) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xa9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xab) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xac) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xad) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xae) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xaf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xb9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xba) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xbf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 199) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 200) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xc9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xca) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xce) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xcf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xd9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xda) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xde) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xdf) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xe9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xea) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xeb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xec) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xed) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xee) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xef) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf0) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf1) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf2) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf3) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf4) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf5) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf6) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf7) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf8) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xf9) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfa) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfb) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfc) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfd) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xfe) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0xff) = '\t';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x100) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x101) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x102) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x103) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x104) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x105) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x106) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x107) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x108) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x109) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10a) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10b) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10c) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10d) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10e) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x10f) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x110) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x111) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x112) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x113) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x114) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x115) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x116) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x117) = '\a';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x118) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x119) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11a) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11b) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11c) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11d) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11e) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 0) + 0x11f) = '\b';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar8 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar8 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0xf) = '\x05';
    pamVar8 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x17) = '\x05';
    pamVar8 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar8 + 1) + 0x1f) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    d->m_bit_buffer = d->m_bit_buffer | 1 << ((byte)d->m_bits_in & 0x1f);
    uVar13 = d->m_bits_in + 2;
    d->m_bits_in = uVar13;
    while (7 < uVar13) {
      pmVar18 = d->m_pOutput_buf;
      if (pmVar18 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar18 + 1;
        *pmVar18 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar13 = d->m_bits_in - 8;
      d->m_bits_in = uVar13;
    }
  }
  pmVar18 = d->m_lz_code_buf;
  if (pmVar18 < d->m_pLZ_code_buf) {
    uVar13 = 1;
    do {
      if (uVar13 == 1) {
        bVar22 = *pmVar18;
        pmVar18 = pmVar18 + 1;
        uVar13 = bVar22 | 0x100;
      }
      if ((uVar13 & 1) == 0) {
        bVar22 = d->m_huff_code_sizes[0][*pmVar18];
        if (bVar22 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][lit]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xcf2,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        uVar4 = d->m_huff_codes[0][*pmVar18];
        if (uVar4 >> (bVar22 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xcf3,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        d->m_bit_buffer = d->m_bit_buffer | (uint)uVar4 << ((byte)d->m_bits_in & 0x1f);
        pmVar18 = pmVar18 + 1;
        uVar11 = (uint)bVar22 + d->m_bits_in;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar11 = d->m_bits_in - 8;
          d->m_bits_in = uVar11;
        }
      }
      else {
        bVar22 = *pmVar18;
        bVar24 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar22]];
        if (bVar24 == 0) {
          __assert_fail("d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xce0,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        uVar4 = d->m_huff_codes[0][s_tdefl_len_sym[bVar22]];
        if (uVar4 >> (bVar24 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xce2,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        bVar3 = pmVar18[2];
        uVar6 = *(ushort *)(pmVar18 + 1);
        d->m_bit_buffer = d->m_bit_buffer | (uint)uVar4 << ((byte)d->m_bits_in & 0x1f);
        uVar11 = (uint)bVar24 + d->m_bits_in;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar11 = d->m_bits_in - 8;
          d->m_bits_in = uVar11;
        }
        bVar24 = ""[bVar22];
        if ((mz_bitmasks[bVar24] & (uint)bVar22) >> (bVar24 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xce4,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        d->m_bit_buffer =
             d->m_bit_buffer | (mz_bitmasks[bVar24] & (uint)bVar22) << ((byte)uVar11 & 0x1f);
        uVar11 = bVar24 + uVar11;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar11 = d->m_bits_in - 8;
          d->m_bits_in = uVar11;
        }
        uVar19 = (uint)uVar6;
        pbVar21 = "" + bVar3;
        pbVar7 = "" + bVar3;
        if (bVar3 < 2) {
          pbVar21 = "" + uVar19;
          pbVar7 = "" + uVar19;
        }
        bVar22 = d->m_huff_code_sizes[1][*pbVar21];
        if (bVar22 == 0) {
          __assert_fail("d->m_huff_code_sizes[1][sym]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xced,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        uVar4 = d->m_huff_codes[1][*pbVar21];
        if (uVar4 >> (bVar22 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xcee,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        bVar24 = *pbVar7;
        d->m_bit_buffer = d->m_bit_buffer | (uint)uVar4 << ((byte)uVar11 & 0x1f);
        uVar11 = bVar22 + uVar11;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar11 = d->m_bits_in - 8;
          d->m_bits_in = uVar11;
        }
        if ((uVar19 & mz_bitmasks[bVar24]) >> (bVar24 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                        ,0xcef,
                        "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)"
                       );
        }
        d->m_bit_buffer = d->m_bit_buffer | (uVar19 & mz_bitmasks[bVar24]) << ((byte)uVar11 & 0x1f);
        pmVar18 = pmVar18 + 3;
        uVar11 = bVar24 + uVar11;
        d->m_bits_in = uVar11;
        while (7 < uVar11) {
          pmVar5 = d->m_pOutput_buf;
          if (pmVar5 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar5 + 1;
            *pmVar5 = (mz_uint8)d->m_bit_buffer;
          }
          d->m_bit_buffer = d->m_bit_buffer >> 8;
          uVar11 = d->m_bits_in - 8;
          d->m_bits_in = uVar11;
        }
      }
      uVar13 = uVar13 >> 1;
    } while (pmVar18 < d->m_pLZ_code_buf);
  }
  uVar4 = d->m_huff_codes[0][0x100];
  bVar22 = d->m_huff_code_sizes[0][0x100];
  if (uVar4 >> (bVar22 & 0x1f) == 0) {
    d->m_bit_buffer = d->m_bit_buffer | (uint)uVar4 << ((byte)d->m_bits_in & 0x1f);
    uVar13 = (uint)bVar22 + d->m_bits_in;
    d->m_bits_in = uVar13;
    while (7 < uVar13) {
      pmVar18 = d->m_pOutput_buf;
      if (pmVar18 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar18 + 1;
        *pmVar18 = (mz_uint8)d->m_bit_buffer;
      }
      d->m_bit_buffer = d->m_bit_buffer >> 8;
      uVar13 = d->m_bits_in - 8;
      d->m_bits_in = uVar13;
    }
    return (uint)(d->m_pOutput_buf < d->m_pOutput_buf_end);
  }
  __assert_fail("bits <= ((1U << len) - 1U)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                ,0xcf7,
                "mz_bool (anonymous namespace)::miniz::tdefl_compress_lz_codes(tdefl_compressor *)")
  ;
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor *d, mz_bool static_block) {
  if (static_block)
    tdefl_start_static_block(d);
  else
    tdefl_start_dynamic_block(d);
  return tdefl_compress_lz_codes(d);
}